

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void helicsQueryExecuteAsync(HelicsQuery query,HelicsFederate fed,HelicsError *err)

{
  char *pcVar1;
  QueryObject *pQVar2;
  string_view target;
  string_view queryStr;
  string_view queryStr_00;
  shared_ptr<helics::Federate> fedObj;
  undefined1 local_34 [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  pQVar2 = anon_unknown.dwarf_1862f::getQueryObj(query,err);
  if (pQVar2 != (QueryObject *)0x0) {
    getFedSharedPtr(local_34 + 4,(HelicsError *)fed);
    if (local_34._4_8_ == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&pQVar2->response,
                 "{{\n  \"error\":{{\n    \"code\":404,\n    \"message\":\"federate object is not valid\"\n  }}\n}}"
                );
    }
    else {
      pcVar1 = (char *)(pQVar2->target)._M_string_length;
      if (pcVar1 == (char *)0x0) {
        queryStr._M_str = (char *)(pQVar2->query)._M_string_length;
        queryStr._M_len = local_34._4_8_;
        helics::Federate::queryAsync
                  ((Federate *)local_34,queryStr,
                   (HelicsSequencingModes)(pQVar2->query)._M_dataplus._M_p);
      }
      else {
        target._M_str = pcVar1;
        target._M_len = local_34._4_8_;
        queryStr_00._M_str = (char *)(pQVar2->query)._M_string_length;
        queryStr_00._M_len = (size_t)(pQVar2->target)._M_dataplus._M_p;
        helics::Federate::queryAsync
                  ((Federate *)local_34,target,queryStr_00,
                   (HelicsSequencingModes)(pQVar2->query)._M_dataplus._M_p);
      }
      (pQVar2->asyncIndexCode).ivalue = local_34._0_4_;
      pQVar2->activeAsync = true;
      std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pQVar2->activeFed).
                  super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> *)(local_34 + 4));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  }
  return;
}

Assistant:

void helicsQueryExecuteAsync(HelicsQuery query, HelicsFederate fed, HelicsError* err)
{
    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return;
    }
    auto fedObj = getFedSharedPtr(fed, err);
    if (fedObj == nullptr) {
        queryObj->response = invalidFedObConst;
        return;
    }
    try {
        if (queryObj->target.empty()) {
            queryObj->asyncIndexCode = fedObj->queryAsync(queryObj->query);
        } else {
            queryObj->asyncIndexCode = fedObj->queryAsync(queryObj->target, queryObj->query);
        }
        queryObj->activeAsync = true;
        queryObj->activeFed = fedObj;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}